

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_utf8_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint local_44;
  uint local_40;
  int e;
  int c;
  int nByte;
  uchar *zEnd;
  uchar *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (uchar *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    zEnd = (uchar *)jx9_value_to_string(*apArg,&e);
    if (e < 1) {
      jx9_result_null(pjStack_18);
    }
    else {
      _c = zEnd + e;
      while (zEnd < _c) {
        local_40 = (uint)*zEnd;
        zEnd = zEnd + 1;
        if (local_40 < 0x80) {
          local_44 = local_40;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
        }
        else if (local_40 < 0x800) {
          local_44 = ((int)local_40 >> 6) + 0xc0;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = (local_40 & 0x3f) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
        }
        else if (local_40 < 0x10000) {
          local_44 = 0xe0;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = ((int)local_40 >> 6 & 0x3fU) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = (local_40 & 0x3f) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
        }
        else {
          local_44 = 0xf0;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = ((int)local_40 >> 0xc & 0x3fU) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = ((int)local_40 >> 6 & 0x3fU) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
          local_44 = (local_40 & 0x3f) + 0x80;
          jx9_result_string(pjStack_18,(char *)&local_44,1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_utf8_encode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nByte, c, e;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = (const unsigned char *)jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zEnd = &zIn[nByte];
	/* Start the encoding process */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		c = zIn[0];
		/* Advance the stream cursor */
		zIn++;
		/* Encode */
		if( c<0x00080 ){
			e = (c&0xFF);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x00800 ){
			e = 0xC0 + ((c>>6)&0x1F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x10000 ){
			e = 0xE0 + ((c>>12)&0x0F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else{
			e = 0xF0 + ((c>>18) & 0x07);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>12) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		} 
	}
	/* All done */
	return JX9_OK;
}